

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_unlink_readonly(void)

{
  uv_buf_t uVar1;
  ssize_t sVar2;
  int iVar3;
  uv_loop_t *loop;
  undefined8 uVar4;
  char *pcVar5;
  uv_fs_t req;
  
  unlink("test_file");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar3 = uv_fs_open(0,&req,"test_file",0x42,0x180,0);
  sVar2 = req.result;
  uVar1.len = iov.len;
  uVar1.base = iov.base;
  if (iVar3 < 0) {
    pcVar5 = "r >= 0";
    uVar4 = 0x678;
  }
  else if (req.result < 0) {
    pcVar5 = "req.result >= 0";
    uVar4 = 0x679;
    iov = uVar1;
  }
  else {
    uv_fs_req_cleanup(&req);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar3 = uv_fs_write(0,&req,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff,0);
    if (iVar3 == 0xd) {
      if (req.result == 0xd) {
        uv_fs_req_cleanup(&req);
        uv_fs_close(::loop,&req,sVar2 & 0xffffffff,0);
        iVar3 = uv_fs_chmod(0,&req,"test_file",0x100,0);
        if (iVar3 == 0) {
          if (req.result == 0) {
            uv_fs_req_cleanup(&req);
            check_permission("test_file",0x100);
            iVar3 = uv_fs_unlink(0,&req,"test_file",0);
            if (iVar3 == 0) {
              if (req.result == 0) {
                uv_fs_req_cleanup(&req);
                uv_run(::loop,0);
                uv_fs_chmod(0,&req,"test_file",0x180,0);
                uv_fs_req_cleanup(&req);
                unlink("test_file");
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar4 = uv_default_loop();
                iVar3 = uv_loop_close(uVar4);
                if (iVar3 == 0) {
                  return 0;
                }
                pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                uVar4 = 0x69e;
              }
              else {
                pcVar5 = "req.result == 0";
                uVar4 = 0x690;
              }
            }
            else {
              pcVar5 = "r == 0";
              uVar4 = 0x68f;
            }
          }
          else {
            pcVar5 = "req.result == 0";
            uVar4 = 0x688;
          }
        }
        else {
          pcVar5 = "r == 0";
          uVar4 = 0x687;
        }
      }
      else {
        pcVar5 = "req.result == sizeof(test_buf)";
        uVar4 = 0x680;
      }
    }
    else {
      pcVar5 = "r == sizeof(test_buf)";
      uVar4 = 0x67f;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(fs_unlink_readonly) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL,
                 &req,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  uv_fs_close(loop, &req, file, NULL);

  /* Make the file read-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0400, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0400);

  /* Try to unlink the file */
  r = uv_fs_unlink(NULL, &req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
  * Run the loop just to check we don't have make any extraneous uv_ref()
  * calls. This should drop out immediately.
  */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  uv_fs_chmod(NULL, &req, "test_file", 0600, NULL);
  uv_fs_req_cleanup(&req);
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}